

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O2

timestamp_t
duckdb::DateTrunc::MillisecondOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t>
          (timestamp_t input)

{
  dtime_t time_00;
  timestamp_t tVar1;
  date_t date;
  int32_t micros;
  int32_t sec;
  int32_t min;
  int32_t hour;
  dtime_t time;
  date_t local_44;
  int local_40;
  int32_t local_3c;
  int32_t local_38;
  int32_t local_34;
  dtime_t local_30;
  
  Timestamp::Convert(input,&local_44,&local_30);
  Time::Convert(local_30,&local_34,&local_38,&local_3c,&local_40);
  local_40 = local_40 - local_40 % 1000;
  time_00 = Time::FromTime(local_34,local_38,local_3c,local_40);
  tVar1 = Timestamp::FromDatetime(local_44,time_00);
  return (timestamp_t)tVar1.value;
}

Assistant:

static inline TR Operation(TA input) {
			int32_t hour, min, sec, micros;
			date_t date;
			dtime_t time;
			Timestamp::Convert(input, date, time);
			Time::Convert(time, hour, min, sec, micros);
			micros -= UnsafeNumericCast<int32_t>(micros % Interval::MICROS_PER_MSEC);
			return Timestamp::FromDatetime(date, Time::FromTime(hour, min, sec, micros));
		}